

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<char16_t>::growAppend
          (QCommonArrayOps<char16_t> *this,char16_t *b,char16_t *e)

{
  long n;
  char16_t *pcVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  char16_t *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 1;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    pcVar1 = (this->super_Type).super_QArrayDataPointer<char16_t>.ptr;
    if ((b < pcVar1) || (pcVar1 + (this->super_Type).super_QArrayDataPointer<char16_t>.size <= b)) {
      QArrayDataPointer<char16_t>::detachAndGrow
                ((QArrayDataPointer<char16_t> *)this,GrowsAtEnd,n,(char16_t **)0x0,
                 (QArrayDataPointer<char16_t> *)0x0);
      pcVar1 = b;
    }
    else {
      QArrayDataPointer<char16_t>::detachAndGrow
                ((QArrayDataPointer<char16_t> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pcVar1 = local_28;
    }
    QPodArrayOps<char16_t>::copyAppend
              (&this->super_Type,pcVar1,(char16_t *)(((long)e - (long)b) + (long)pcVar1));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }